

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

bool __thiscall DynamicGraph::areConnected(DynamicGraph *this,Vertex *v,Vertex *u)

{
  value_type vVar1;
  runtime_error *this_00;
  reference pvVar2;
  Vertex *u_local;
  Vertex *v_local;
  DynamicGraph *this_local;
  
  if ((this->isInitialized & 1U) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Dynamic Graph not initialized!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->components,*v);
  vVar1 = *pvVar2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->components,*u);
  return vVar1 == *pvVar2;
}

Assistant:

bool DynamicGraph::areConnected(const Vertex &v, const Vertex &u)
{
    if(!this->isInitialized) {
        throw std::runtime_error("Dynamic Graph not initialized!");
    }
    return this->components[v] == this->components[u];
}